

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O3

int write_nal_unit(h264_stream_t *h,uint8_t *buf,int size)

{
  char cVar1;
  uint uVar2;
  nal_t *pnVar3;
  int iVar4;
  undefined8 in_RAX;
  byte *rbsp_buf;
  bs_t *b;
  byte *pbVar5;
  int iVar6;
  uint uVar7;
  bool bVar8;
  int nal_size;
  int local_38;
  int local_34;
  
  pnVar3 = h->nal;
  _local_38 = CONCAT44((int)((ulong)in_RAX >> 0x20),size);
  rbsp_buf = (byte *)calloc(1,(long)size);
  iVar6 = size * 3 + 3;
  if (-1 < size * 3) {
    iVar6 = size * 3;
  }
  _local_38 = CONCAT44(iVar6 >> 2,local_38);
  b = (bs_t *)malloc(0x20);
  b->start = rbsp_buf;
  b->p = rbsp_buf;
  b->end = rbsp_buf + (iVar6 >> 2);
  uVar2 = pnVar3->nal_ref_idc;
  iVar6 = 7;
  uVar7 = 1;
  pbVar5 = rbsp_buf;
  do {
    iVar6 = iVar6 + -1;
    b->bits_left = iVar6;
    if (pbVar5 < b->end) {
      *pbVar5 = *pbVar5 & ~(byte)(1 << ((byte)iVar6 & 0x1f));
      iVar6 = b->bits_left;
      pbVar5 = b->p;
      *pbVar5 = *pbVar5 | ((uVar2 >> (uVar7 & 0x1f) & 1) != 0) << ((byte)iVar6 & 0x1f);
    }
    if (iVar6 == 0) {
      pbVar5 = pbVar5 + 1;
      b->p = pbVar5;
      b->bits_left = 8;
      iVar6 = 8;
    }
    bVar8 = uVar7 != 0;
    uVar7 = uVar7 - 1;
  } while (bVar8);
  uVar2 = pnVar3->nal_unit_type;
  uVar7 = 4;
  do {
    iVar6 = iVar6 + -1;
    b->bits_left = iVar6;
    if (pbVar5 < b->end) {
      *pbVar5 = *pbVar5 & ~(byte)(1 << ((byte)iVar6 & 0x1f));
      iVar6 = b->bits_left;
      pbVar5 = b->p;
      *pbVar5 = *pbVar5 | ((uVar2 >> (uVar7 & 0x1f) & 1) != 0) << ((byte)iVar6 & 0x1f);
    }
    if (iVar6 == 0) {
      pbVar5 = pbVar5 + 1;
      b->p = pbVar5;
      b->bits_left = 8;
      iVar6 = 8;
    }
    bVar8 = uVar7 != 0;
    uVar7 = uVar7 - 1;
  } while (bVar8);
  iVar4 = pnVar3->nal_unit_type;
  if (iVar4 == 0xe) {
LAB_0012b229:
    cVar1 = pnVar3->svc_extension_flag;
LAB_0012b235:
    iVar6 = iVar6 + -1;
    b->bits_left = iVar6;
    if (pbVar5 < b->end) {
      *pbVar5 = *pbVar5 & ~(byte)(1 << ((byte)iVar6 & 0x1f));
      iVar6 = b->bits_left;
      pbVar5 = b->p;
      *pbVar5 = *pbVar5 | cVar1 << ((byte)iVar6 & 0x1f);
    }
    if (iVar6 == 0) {
      b->p = pbVar5 + 1;
      b->bits_left = 8;
    }
    if (pnVar3->svc_extension_flag == true) {
      write_nal_unit_header_svc_extension(pnVar3->nal_svc_ext,b);
    }
    iVar4 = pnVar3->nal_unit_type;
  }
  else {
    if (iVar4 == 0x15) {
      cVar1 = pnVar3->avc_3d_extension_flag;
      goto LAB_0012b235;
    }
    if (iVar4 == 0x14) goto LAB_0012b229;
  }
  iVar6 = -1;
  switch(iVar4) {
  case 1:
  case 5:
  case 0x13:
  case 0x14:
    write_slice_layer_rbsp(h,b);
    goto LAB_0012b303;
  default:
    goto switchD_0012b2a2_caseD_2;
  case 7:
    write_seq_parameter_set_rbsp(h->sps,b);
    break;
  case 8:
    write_pic_parameter_set_rbsp(h,b);
    break;
  case 9:
    write_access_unit_delimiter_rbsp(h,b);
    break;
  case 10:
  case 0xb:
    break;
  case 0xe:
    if (h->nal->svc_extension_flag == true) {
      write_prefix_nal_unit_svc(h->nal,b);
    }
    break;
  case 0xf:
    write_subset_seq_parameter_set_rbsp(h->sps_subset,b);
  }
  write_rbsp_trailing_bits(b);
LAB_0012b303:
  if (b->end < b->p) {
    free(b);
    free(rbsp_buf);
  }
  else {
    _local_38 = CONCAT44((int)b->p - *(int *)&b->start,local_38);
    iVar4 = rbsp_to_nal(rbsp_buf,&local_34,buf,&local_38);
    free(b);
    free(rbsp_buf);
    iVar6 = -1;
    if (-1 < iVar4) {
      iVar6 = local_38;
    }
  }
switchD_0012b2a2_caseD_2:
  return iVar6;
}

Assistant:

int write_nal_unit(h264_stream_t* h, uint8_t* buf, int size)
{
    nal_t* nal = h->nal;

    int nal_size = size;
    int rbsp_size = size;
    uint8_t* rbsp_buf = (uint8_t*)calloc(1, rbsp_size);

    if( 0 )
    {
        int rc = nal_to_rbsp(buf, &nal_size, rbsp_buf, &rbsp_size);

        if (rc < 0) { free(rbsp_buf); return -1; } // handle conversion error
    }

    if( 1 )
    {
        rbsp_size = size*3/4; // NOTE this may have to be slightly smaller (3/4 smaller, worst case) in order to be guaranteed to fit
    }

    bs_t* b = bs_new(rbsp_buf, rbsp_size);
    /* forbidden_zero_bit */ bs_write_u(b, 1, 0);
    bs_write_u(b, 2, nal->nal_ref_idc);
    bs_write_u(b, 5, nal->nal_unit_type);
    
    if( nal->nal_unit_type == 14 || nal->nal_unit_type == 21 || nal->nal_unit_type == 20 )
    {
        if( nal->nal_unit_type != 21 )
        {
            bs_write_u1(b, nal->svc_extension_flag);
        }
        else
        {
            bs_write_u1(b, nal->avc_3d_extension_flag);
        }
        
        if( nal->svc_extension_flag )
        {
            write_nal_unit_header_svc_extension(nal->nal_svc_ext, b);
        }
    }

    switch ( nal->nal_unit_type )
    {
        case NAL_UNIT_TYPE_CODED_SLICE_IDR:
        case NAL_UNIT_TYPE_CODED_SLICE_NON_IDR:  
        case NAL_UNIT_TYPE_CODED_SLICE_AUX:
            write_slice_layer_rbsp(h, b);
            break;

#ifdef HAVE_SEI
        case NAL_UNIT_TYPE_SEI:
            write_sei_rbsp(h, b);
            write_rbsp_trailing_bits(b);
            break;
#endif

        case NAL_UNIT_TYPE_SPS: 
            write_seq_parameter_set_rbsp(h->sps, b);
            write_rbsp_trailing_bits(b);
            
            if( 0 )
            {
                memcpy(h->sps_table[h->sps->seq_parameter_set_id], h->sps, sizeof(sps_t));
            }

            break;

        case NAL_UNIT_TYPE_PPS:   
            write_pic_parameter_set_rbsp(h, b);
            write_rbsp_trailing_bits(b);
            break;

        case NAL_UNIT_TYPE_AUD:     
            write_access_unit_delimiter_rbsp(h, b); 
            write_rbsp_trailing_bits(b);
            break;

        case NAL_UNIT_TYPE_END_OF_SEQUENCE: 
            write_end_of_seq_rbsp(h, b);
            write_rbsp_trailing_bits(b);
            break;

        case NAL_UNIT_TYPE_END_OF_STREAM: 
            write_end_of_stream_rbsp(h, b);
            write_rbsp_trailing_bits(b);
            break;

        //SVC support
        case NAL_UNIT_TYPE_SUBSET_SPS:
            write_subset_seq_parameter_set_rbsp(h->sps_subset, b);
            write_rbsp_trailing_bits(b);
            
            if( 0 )
            {
                memcpy(h->sps_subset_table[h->sps_subset->sps->seq_parameter_set_id], h->sps_subset, sizeof(sps_subset_t));
                //memcpy(h->sps_subset_table[h->sps_subset->sps->seq_parameter_set_id]->sps, h->sps_subset->sps, sizeof(sps_t));
                //memcpy(h->sps_subset_table[h->sps_subset->sps->seq_parameter_set_id]->sps_svc_ext, h->sps_subset->sps_svc_ext, sizeof(sps_svc_ext_t));
                //h->sps_subset_table[h->sps_subset->sps->seq_parameter_set_id]->additional_extension2_flag = h->sps_subset->additional_extension2_flag;
            }

            break;
            
        //prefix NAL
        case NAL_UNIT_TYPE_PREFIX_NAL:
            write_prefix_nal_unit_rbsp(h->nal, b);
            write_rbsp_trailing_bits(b);
            break;
            
        //SVC support
        case NAL_UNIT_TYPE_CODED_SLICE_SVC_EXTENSION:            
            write_slice_layer_rbsp(h, b);
            
            break;
            
        case NAL_UNIT_TYPE_FILLER:
        case NAL_UNIT_TYPE_SPS_EXT:
        case NAL_UNIT_TYPE_UNSPECIFIED:
        case NAL_UNIT_TYPE_CODED_SLICE_DATA_PARTITION_A:  
        case NAL_UNIT_TYPE_CODED_SLICE_DATA_PARTITION_B: 
        case NAL_UNIT_TYPE_CODED_SLICE_DATA_PARTITION_C:
        default:
            return -1;
    }

    if (bs_overrun(b)) { bs_free(b); free(rbsp_buf); return -1; }

    if( 1 )
    {
        // now get the actual size used
        rbsp_size = bs_pos(b);

        int rc = rbsp_to_nal(rbsp_buf, &rbsp_size, buf, &nal_size);
        if (rc < 0) { bs_free(b); free(rbsp_buf); return -1; }
    }

    bs_free(b);
    free(rbsp_buf);

    return nal_size;
}